

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O3

void __thiscall
UnifiedRegex::Matcher::Matcher(Matcher *this,ScriptContext *scriptContext,RegexPattern *pattern)

{
  Type *addr;
  Type *addr_00;
  ushort uVar1;
  int iVar2;
  Program *pPVar3;
  code *pcVar4;
  bool bVar5;
  BOOL BVar6;
  StandardChars<char16_t> *pSVar7;
  Recycler *pRVar8;
  undefined4 *puVar9;
  GroupInfo *pGVar10;
  LoopInfo *pLVar11;
  GroupInfo *pGVar12;
  Type *addr_01;
  size_t size;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  Memory::Recycler::WBSetBit((char *)this);
  (this->pattern).ptr = pattern;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(this);
  pSVar7 = ThreadContext::GetStandardChars(scriptContext->threadContext,(char16 *)0x0);
  Memory::Recycler::WBSetBit((char *)&this->standardChars);
  (this->standardChars).ptr = pSVar7;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->standardChars);
  addr = &this->program;
  pPVar3 = (pattern->rep).unified.program.ptr;
  Memory::Recycler::WBSetBit((char *)addr);
  (this->program).ptr = pPVar3;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  (this->literalNextSyncInputOffsets).ptr = (uint *)0x0;
  (this->groupInfos).ptr = (GroupInfo *)0x0;
  (this->loopInfos).ptr = (LoopInfo *)0x0;
  pRVar8 = scriptContext->recycler;
  this->recycler = pRVar8;
  this->previousQcTime = 0;
  this->stats = (Type)0x0;
  this->w = (Type)0x0;
  data.plusSize = (size_t)((this->program).ptr)->numGroups;
  local_58 = (undefined1  [8])&GroupInfo::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_a8a6704;
  data.filename._0_4_ = 0x1344;
  pRVar8 = Memory::Recycler::TrackAllocInfo(pRVar8,(TrackAllocData *)local_58);
  uVar1 = ((this->program).ptr)->numGroups;
  if ((ulong)uVar1 == 0) {
    Memory::Recycler::ClearTrackAllocInfo(pRVar8,(TrackAllocData *)0x0);
    pGVar10 = (GroupInfo *)&DAT_00000008;
  }
  else {
    BVar6 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar6 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar5) goto LAB_00ee6752;
      *puVar9 = 0;
    }
    pGVar10 = (GroupInfo *)
              Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                        (pRVar8,(ulong)((uint)uVar1 * 8));
    if (pGVar10 == (GroupInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar5) goto LAB_00ee6752;
      *puVar9 = 0;
    }
    pGVar12 = pGVar10;
    do {
      pGVar12->offset = 0;
      pGVar12->length = 0xffffffff;
      pGVar12 = pGVar12 + 1;
    } while (pGVar12 != pGVar10 + uVar1);
  }
  addr_00 = &this->groupInfos;
  Memory::Recycler::WBSetBit((char *)addr_00);
  addr_00->ptr = pGVar10;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_00);
  data.plusSize = (size_t)addr->ptr->numLoops;
  if (0 < (long)data.plusSize) {
    local_58 = (undefined1  [8])&LoopInfo::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_a8a6704;
    data.filename._0_4_ = 0x1348;
    pRVar8 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_58);
    iVar2 = ((this->program).ptr)->numLoops;
    if ((long)iVar2 == 0) {
      Memory::Recycler::ClearTrackAllocInfo(pRVar8,(TrackAllocData *)0x0);
      pLVar11 = (LoopInfo *)&DAT_00000008;
    }
    else {
      size = 0xffffffffffffffff;
      if (-1 < iVar2) {
        size = (long)iVar2 << 4;
      }
      BVar6 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar6 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                           "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar5) goto LAB_00ee6752;
        *puVar9 = 0;
      }
      pLVar11 = (LoopInfo *)
                Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)32,false>
                          (pRVar8,size);
      if (pLVar11 == (LoopInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar5) {
LAB_00ee6752:
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar9 = 0;
        pLVar11 = (LoopInfo *)0x0;
      }
    }
    addr_01 = &this->loopInfos;
    Memory::Recycler::WBSetBit((char *)addr_01);
    addr_01->ptr = pLVar11;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_01);
  }
  return;
}

Assistant:

Matcher::Matcher(Js::ScriptContext* scriptContext, RegexPattern* pattern)
        : pattern(pattern)
        , standardChars(scriptContext->GetThreadContext()->GetStandardChars((char16*)0))
        , program(pattern->rep.unified.program)
        , groupInfos(nullptr)
        , loopInfos(nullptr)
        , literalNextSyncInputOffsets(nullptr)
        , recycler(scriptContext->GetRecycler())
        , previousQcTime(0)
#if ENABLE_REGEX_CONFIG_OPTIONS
        , stats(0)
        , w(0)
#endif
    {
        // Don't need to zero out - the constructor for GroupInfo should take care of it
        groupInfos = RecyclerNewArrayLeaf(recycler, GroupInfo, program->numGroups);

        if (program->numLoops > 0)
        {
            loopInfos = RecyclerNewArrayLeafZ(recycler, LoopInfo, program->numLoops);
        }
    }